

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsInputSetDefaultComplexVector
               (HelicsInput inp,double *vectorInput,int vectorLength,HelicsError *err)

{
  Input *pIVar1;
  InputObject *pIVar2;
  ulong __n;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  
  pIVar2 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  if (pIVar2 != (InputObject *)0x0) {
    if (vectorInput == (double *)0x0 || vectorLength < 1) {
      pIVar1 = pIVar2->inputPtr;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n = (ulong)(uint)vectorLength;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (&local_48,__n);
      do {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_48,
                   vectorInput,vectorInput + 1);
        vectorInput = vectorInput + 2;
        __n = __n - 1;
      } while (__n != 0);
      pIVar1 = pIVar2->inputPtr;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&pIVar1->lastValue,&local_48);
    if (local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void helicsInputSetDefaultComplexVector(HelicsInput inp, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            inpObj->inputPtr->setDefault(std::vector<std::complex<double>>{});
        } else {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(vectorLength);
            for (std::ptrdiff_t ii = 0; ii < vectorLength; ++ii) {
                cvec.emplace_back(vectorInput[2 * ii], vectorInput[2 * ii + 1]);
            }
            inpObj->inputPtr->setDefault(std::move(cvec));
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}